

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void __thiscall MIDIStreamer::Precache(MIDIStreamer *this)

{
  uint uVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 extraout_var;
  DWORD *event;
  DWORD (*paDVar4) [384];
  uint uVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  BYTE *pBVar9;
  int i;
  long lVar10;
  WORD packnum;
  ushort local_25a;
  TArray<unsigned_short,_unsigned_short> packed;
  BYTE found_banks [256];
  BYTE found_instruments [256];
  
  bVar7 = false;
  memset(found_instruments,0,0x100);
  memset(found_banks,0,0x100);
  this->LoopLimit = 1;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  found_banks[0] = '\x01';
  found_banks[0x80] = '\x01';
  do {
    iVar3 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
    pp_Var2 = (this->super_MusInfo)._vptr_MusInfo;
    if ((char)iVar3 != '\0') {
      (*pp_Var2[0x18])(this);
      packed.Array = (unsigned_short *)0x0;
      packed.Most = 0;
      packed.Count = 0;
      for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
        if (found_instruments[lVar10] != '\0') {
          packnum = (ushort)(((uint)lVar10 & 0x80) << 7) | (ushort)lVar10 & 0x7f;
          if (bVar7) {
            pBVar9 = found_banks + ((uint)lVar10 & 0x80);
            for (lVar6 = 0; lVar6 != 0x4000; lVar6 = lVar6 + 0x80) {
              if (*pBVar9 != '\0') {
                local_25a = packnum | (ushort)lVar6;
                TArray<unsigned_short,_unsigned_short>::Push(&packed,&local_25a);
              }
              pBVar9 = pBVar9 + 1;
            }
          }
          else {
            TArray<unsigned_short,_unsigned_short>::Push(&packed,&packnum);
          }
        }
      }
      (*this->MIDI->_vptr_MIDIDevice[0x11])(this->MIDI,packed.Array,(ulong)packed._8_8_ >> 0x20);
      TArray<unsigned_short,_unsigned_short>::~TArray(&packed);
      return;
    }
    iVar3 = (*pp_Var2[0x1c])(this,this->Events,this->Events + 1,600000000);
    for (paDVar4 = this->Events; paDVar4 < (undefined1 *)CONCAT44(extraout_var,iVar3);
        paDVar4 = (DWORD (*) [384])((long)*paDVar4 + lVar10)) {
      uVar1 = (*paDVar4)[2];
      if (uVar1 < 0x1000000) {
        uVar5 = uVar1 >> 8 & 0x7f;
        pBVar9 = found_instruments;
        if ((uVar1 & 0xf) == 9 || (uVar1 & 0x70) != 0x40) {
          if (uVar5 == 0 || (uVar1 & 0x7f) != 0x49) {
            uVar8 = uVar1 >> 0x10 & 0x7f;
            if (uVar8 != 0 && (uVar1 & 0x7f) == 0x19) {
              uVar5 = uVar5 | 0x80;
              goto LAB_0035bd93;
            }
            if (((uVar8 == 0) || ((uVar1 & 0x70) != 0x30)) || (uVar5 != 0)) goto LAB_0035bd99;
            uVar5 = uVar8;
            if ((uVar1 & 0xf) == 9) {
              uVar5 = uVar1 >> 0x10 | 0x80;
            }
          }
          else {
            uVar5 = uVar5 | 0x80;
          }
          bVar7 = true;
          pBVar9 = found_banks;
        }
LAB_0035bd93:
        pBVar9[uVar5] = '\x01';
      }
LAB_0035bd99:
      lVar10 = (ulong)(((*paDVar4)[2] & 0xffffff) + 3 & 0xfffffffc) + 0xc;
      if (-1 < (int)(*paDVar4)[2]) {
        lVar10 = 0xc;
      }
    }
  } while( true );
}

Assistant:

void MIDIStreamer::Precache()
{
	BYTE found_instruments[256] = { 0, };
	BYTE found_banks[256] = { 0, };
	bool multiple_banks = false;

	LoopLimit = 1;
	DoRestart();
	found_banks[0] = true;		// Bank 0 is always used.
	found_banks[128] = true;

	// Simulate playback to pick out used instruments.
	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				int command = (event[2] & 0x70);
				int channel = (event[2] & 0x0f);
				int data1 = (event[2] >> 8) & 0x7f;
				int data2 = (event[2] >> 16) & 0x7f;

				if (channel != 9 && command == (MIDI_PRGMCHANGE & 0x70))
				{
					found_instruments[data1] = true;
				}
				else if (channel == 9 && command == (MIDI_PRGMCHANGE & 0x70) && data1 != 0)
				{ // On a percussion channel, program change also serves as bank select.
					multiple_banks = true;
					found_banks[data1 | 128] = true;
				}
				else if (channel == 9 && command == (MIDI_NOTEON & 0x70) && data2 != 0)
				{
					found_instruments[data1 | 128] = true;
				}
				else if (command == (MIDI_CTRLCHANGE & 0x70) && data1 == 0 && data2 != 0)
				{
					multiple_banks = true;
					if (channel == 9)
					{
						found_banks[data2 | 128] = true;
					}
					else
					{
						found_banks[data2] = true;
					}
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}
	DoRestart();

	// Now pack everything into a contiguous region for the PrecacheInstruments call().
	TArray<WORD> packed;

	for (int i = 0; i < 256; ++i)
	{
		if (found_instruments[i])
		{
			WORD packnum = (i & 127) | ((i & 128) << 7);
			if (!multiple_banks)
			{
				packed.Push(packnum);
			}
			else
			{ // In order to avoid having to multiplex tracks in a type 1 file,
			  // precache every used instrument in every used bank, even if not
			  // all combinations are actually used.
				for (int j = 0; j < 128; ++j)
				{
					if (found_banks[j + (i & 128)])
					{
						packed.Push(packnum | (j << 7));
					}
				}
			}
		}
	}
	MIDI->PrecacheInstruments(&packed[0], packed.Size());
}